

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteString(ON_BinaryArchive *this,ON_wString *s)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  wchar_t *sUTF32;
  ulong uVar6;
  uint error_status;
  ON__UINT32 ui32_1;
  ON__UINT32 ui32;
  uint uStack_44;
  ON__UINT16 *local_40;
  undefined8 uStack_38;
  
  ON_wString::IsValid(s,false);
  iVar3 = ON_wString::Length(s);
  uVar6 = 0;
  if (iVar3 != 0) {
    uVar6 = (long)iVar3 + 1;
  }
  if (uVar6 < 2) {
    _ui32 = (undefined **)((ulong)uStack_44 << 0x20);
    bVar2 = WriteInt32(this,1,(ON__INT32 *)&ui32);
  }
  else {
    sUTF32 = ON_wString::Array(s);
    iVar3 = (int)uVar6 + -1;
    error_status = 0;
    bVar2 = false;
    uVar4 = ON_ConvertUTF32ToUTF16
                      (0,(ON__UINT32 *)sUTF32,iVar3,(ON__UINT16 *)0x0,0,&error_status,0xffffffff,
                       0xfffd,(ON__UINT32 **)0x0);
    if (0 < (int)uVar4) {
      error_status = 0;
      uVar1 = uVar4 + 1;
      _ui32 = &PTR__ON_SimpleArray_0080b130;
      local_40 = (ON__UINT16 *)0x0;
      uStack_38._0_4_ = 0;
      uStack_38._4_4_ = 0;
      ON_SimpleArray<unsigned_short>::SetCapacity
                ((ON_SimpleArray<unsigned_short> *)&ui32,(ulong)uVar1);
      if ((int)uVar4 < uStack_38._4_4_) {
        uStack_38._0_4_ = uVar1;
        uVar5 = uVar1;
      }
      else {
        uVar5 = (uint)uStack_38;
      }
      uVar5 = ON_ConvertUTF32ToUTF16
                        (0,(ON__UINT32 *)sUTF32,iVar3,local_40,uVar5,&error_status,0xffffffff,0xfffd
                         ,(ON__UINT32 **)0x0);
      if (uVar5 == uVar4) {
        local_40[uVar4] = 0;
        ui32_1 = uVar1;
        bVar2 = WriteInt32(this,1,(ON__INT32 *)&ui32_1);
        if (ui32_1 != 0 && bVar2) {
          bVar2 = WriteInt16(this,(ulong)ui32_1,(ON__INT16 *)local_40);
        }
      }
      else {
        bVar2 = false;
      }
      ON_SimpleArray<unsigned_short>::~ON_SimpleArray((ON_SimpleArray<unsigned_short> *)&ui32);
    }
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::WriteString( const ON_wString& s )
{
  // No matter what size wchar_t is, this function writes a UTF-16 encoded string
  // to the archive.
#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// about 2 == sizeof(wchar_t).  Since this code has to run on machines
// where sizeof(wchar_t) can be 2, 4, or ... bytes, the test is necessary.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  // The ON_wString::IsValid call prevents corrupt strings from breaking file IO
  // The parameter MUST be false here.
  s.IsValid(false);

  // NOTE WELL:
  //   In some cases there are embedded nulls in strings.
  size_t string_element_count = s.Length();
  if ( string_element_count > 0)
    string_element_count++;
  bool rc = false;
  if ( string_element_count <= 1 )
  {
    ON__UINT32 ui32 = 0;
    rc = WriteInt32(1,(ON__INT32*)&ui32);
  }
  else if ( 2 == sizeof(wchar_t) && string_element_count > 0 ) 
  {
    ON__UINT32 ui32 = (ON__UINT32)string_element_count;
    rc = WriteInt32(1,(ON__INT32*)&ui32);
    if (rc)
      rc = WriteInt16( string_element_count, (const ON__INT16*)s.Array() );
  }
  else if ( 4 == sizeof(wchar_t) && string_element_count > 0 )
  {
    // Assume the string is UTF-32 encoded (this is the case for some gcc implementations).
    const int bTestByteOrder = false;
    const ON__UINT32* sUTF32 = (const ON__UINT32*)s.Array();
    const int sUTF32_count = (int)(string_element_count-1);
    const unsigned int error_mask = 0xFFFFFFFF;
    const ON__UINT32 error_code_point = 0xFFFD; 
    unsigned int error_status = 0;

    const int sUTF16_count = ON_ConvertUTF32ToUTF16(
      bTestByteOrder,
      sUTF32,
      sUTF32_count,
      0, // ON__UINT16* sUTF16,
      0, // int sUTF16_count,
      &error_status,
      error_mask,
      error_code_point,
      0 // const ON__UINT32** sNextUTF32
      );

    if ( sUTF16_count > 0 )
    {
      error_status = 0;
      ON_SimpleArray<ON__UINT16> utf16_buffer(sUTF16_count+1);
      utf16_buffer.SetCount(sUTF16_count+1);
      const int sUTF16_count1 = ON_ConvertUTF32ToUTF16(
        bTestByteOrder,
        sUTF32,
        sUTF32_count,
        utf16_buffer.Array(),
        utf16_buffer.Count(),
        &error_status,
        error_mask,
        error_code_point,
        0 // const ON__UINT32** sNextUTF32
        );
      if ( sUTF16_count1 == sUTF16_count )
      {
        utf16_buffer[sUTF16_count] = 0;
        const ON__UINT32 ui32 = (ON__UINT32)(sUTF16_count+1);
        rc = WriteInt32(1,(const ON__INT32*)&ui32);
        if ( rc && ui32 > 0 )
          rc = WriteInt16( ui32, (const ON__INT16*)utf16_buffer.Array() );
      }
    }
  }
  return rc;  

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif
}